

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetColumnSortDirection
               (int column_n,ImGuiSortDirection sort_direction,bool append_to_sort_specs)

{
  ImGuiTableColumn *pIVar1;
  char cVar2;
  ImGuiTable *table;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumn *pIVar4;
  char cVar5;
  ImGuiTableColumnIdx IVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  
  table = GImGui->CurrentTable;
  bVar7 = *(byte *)((long)&table->Flags + 3) >> 2 & append_to_sort_specs;
  if (bVar7 == 1) {
    if ((long)table->ColumnsCount < 1) {
      IVar6 = '\x01';
    }
    else {
      lVar8 = 0;
      cVar5 = '\0';
      do {
        cVar2 = (&((table->Columns).Data)->SortOrder)[lVar8];
        if (cVar2 < cVar5) {
          cVar2 = cVar5;
        }
        cVar5 = cVar2;
        lVar8 = lVar8 + 0x68;
      } while ((long)table->ColumnsCount * 0x68 - lVar8 != 0);
      IVar6 = cVar5 + '\x01';
    }
  }
  else {
    IVar6 = '\0';
  }
  pIVar3 = (table->Columns).Data;
  pIVar1 = pIVar3 + column_n;
  pIVar3[column_n].field_0x64 = pIVar3[column_n].field_0x64 & 0xfc | (byte)sort_direction & 3;
  if ((sort_direction & 3U) == 0) {
    IVar6 = -1;
  }
  else if ((bVar7 & pIVar1->SortOrder != -1) != 0) goto LAB_0016186c;
  pIVar1->SortOrder = IVar6;
LAB_0016186c:
  if (0 < table->ColumnsCount) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pIVar4 = (table->Columns).Data;
      pIVar3 = (ImGuiTableColumn *)((long)&pIVar4->Flags + lVar9);
      if (pIVar3 != pIVar1 && bVar7 == 0) {
        (&pIVar4->SortOrder)[lVar9] = -1;
      }
      TableFixColumnSortDirection(table,pIVar3);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x68;
    } while (lVar8 < table->ColumnsCount);
  }
  table->IsSettingsDirty = true;
  table->IsSortSpecsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnSortDirection(int column_n, ImGuiSortDirection sort_direction, bool append_to_sort_specs)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!(table->Flags & ImGuiTableFlags_SortMulti))
        append_to_sort_specs = false;
    if (!(table->Flags & ImGuiTableFlags_SortTristate))
        IM_ASSERT(sort_direction != ImGuiSortDirection_None);

    ImGuiTableColumnIdx sort_order_max = 0;
    if (append_to_sort_specs)
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
            sort_order_max = ImMax(sort_order_max, table->Columns[other_column_n].SortOrder);

    ImGuiTableColumn* column = &table->Columns[column_n];
    column->SortDirection = (ImU8)sort_direction;
    if (column->SortDirection == ImGuiSortDirection_None)
        column->SortOrder = -1;
    else if (column->SortOrder == -1 || !append_to_sort_specs)
        column->SortOrder = append_to_sort_specs ? sort_order_max + 1 : 0;

    for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
    {
        ImGuiTableColumn* other_column = &table->Columns[other_column_n];
        if (other_column != column && !append_to_sort_specs)
            other_column->SortOrder = -1;
        TableFixColumnSortDirection(table, other_column);
    }
    table->IsSettingsDirty = true;
    table->IsSortSpecsDirty = true;
}